

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_sizeof_CCtx(ZSTDMT_CCtx *mtctx)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  undefined8 *in_RDI;
  ZSTD_CDict *in_stack_ffffffffffffffc8;
  ZSTDMT_bufferPool *in_stack_ffffffffffffffe0;
  size_t local_8;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_8 = 0;
  }
  else {
    sVar2 = POOL_sizeof((POOL_ctx *)*in_RDI);
    sVar3 = ZSTDMT_sizeof_bufferPool(in_stack_ffffffffffffffe0);
    iVar1 = *(int *)(in_RDI + 0x176);
    sVar4 = ZSTDMT_sizeof_CCtxPool((ZSTDMT_CCtxPool *)in_stack_ffffffffffffffe0);
    lVar5 = sVar2 + 0xc10 + sVar3 + (ulong)(iVar1 + 1) * 0x1b8 + sVar4;
    sVar2 = ZSTDMT_sizeof_seqPool((ZSTDMT_seqPool *)0x281ffb);
    sVar3 = ZSTD_sizeof_CDict(in_stack_ffffffffffffffc8);
    local_8 = lVar5 + sVar2 + sVar3 + in_RDI[0x28];
  }
  return local_8;
}

Assistant:

size_t ZSTDMT_sizeof_CCtx(ZSTDMT_CCtx* mtctx)
{
    if (mtctx == NULL) return 0;   /* supports sizeof NULL */
    return sizeof(*mtctx)
            + POOL_sizeof(mtctx->factory)
            + ZSTDMT_sizeof_bufferPool(mtctx->bufPool)
            + (mtctx->jobIDMask+1) * sizeof(ZSTDMT_jobDescription)
            + ZSTDMT_sizeof_CCtxPool(mtctx->cctxPool)
            + ZSTDMT_sizeof_seqPool(mtctx->seqPool)
            + ZSTD_sizeof_CDict(mtctx->cdictLocal)
            + mtctx->roundBuff.capacity;
}